

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenWriteDisconnected(FdObserver *this)

{
  SourceLocation location;
  long in_RSI;
  PromiseFulfillerPair<void> paf;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_48;
  PromiseBase in_stack_ffffffffffffffd0;
  Disposer *in_stack_ffffffffffffffd8;
  PromiseFulfiller<void> *in_stack_ffffffffffffffe0;
  
  location.function = (char *)in_stack_ffffffffffffffd8;
  location.fileName = (char *)in_stack_ffffffffffffffd0.node.ptr;
  location._16_8_ = in_stack_ffffffffffffffe0;
  newPromiseAndFulfiller<void>(location);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(in_RSI + 0x40),&local_48);
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&local_48);
  this->eventPort = (UnixEventPort *)in_stack_ffffffffffffffd0.node.ptr;
  PromiseFulfillerPair<void>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<void> *)&stack0xffffffffffffffd0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenWriteDisconnected() {
  auto paf = newPromiseAndFulfiller<void>();
  hupFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}